

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int verifyPath(DirHandle *h,char **_fname,int allowMissing)

{
  ulong __n;
  size_t sVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  ErrState *pEVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  PHYSFS_Stat statbuf;
  PHYSFS_Stat local_58;
  
  pcVar9 = *_fname;
  if ((*pcVar9 == '\0') && (h->root == (char *)0x0)) {
    return 1;
  }
  pcVar10 = h->mountPoint;
  if (pcVar10 == (char *)0x0) {
    uVar3 = 1;
    goto LAB_001090ad;
  }
  uVar5 = strlen(pcVar10);
  sVar6 = strlen(pcVar9);
  if (uVar5 < 2) {
    __assert_fail("mntpntlen > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                  ,0x82c,"int verifyPath(DirHandle *, char **, int)");
  }
  __n = uVar5 - 1;
  if (sVar6 < __n) {
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_FOUND);
    uVar3 = 1;
LAB_0010909f:
    bVar11 = false;
  }
  else {
    uVar3 = strncmp(pcVar10,pcVar9,__n);
    if (uVar3 != 0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_NOT_FOUND);
      goto LAB_0010909f;
    }
    if ((__n < sVar6) && (pcVar9[__n] != '/')) {
      PHYSFS_setErrorCode(PHYSFS_ERR_NOT_FOUND);
      uVar3 = 0;
      goto LAB_0010909f;
    }
    if (pcVar9[uVar5 - 1] != '/') {
      uVar5 = __n;
    }
    pcVar9 = pcVar9 + uVar5;
    *_fname = pcVar9;
    uVar3 = 1;
    bVar11 = true;
  }
  if (!bVar11) {
    return 0;
  }
LAB_001090ad:
  pcVar10 = pcVar9;
  if (h->root != (char *)0x0) {
    cVar2 = *pcVar9;
    sVar1 = h->rootlen;
    pcVar10 = pcVar9 + (1 - sVar1);
    strcpy(pcVar10,h->root);
    if (cVar2 != '\0') {
      pcVar9[h->rootlen + (-1 - sVar1)] = '/';
    }
    *_fname = pcVar10;
  }
  if (allowSymLinks == 0) {
    pcVar9 = pcVar10;
    do {
      pcVar7 = strchr(pcVar9,0x2f);
      if (pcVar7 != (char *)0x0) {
        *pcVar7 = '\0';
      }
      iVar4 = (*h->funcs->stat)(h->opaque,pcVar10,&local_58);
      if (iVar4 == 0) {
        pEVar8 = findErrorForCurrentThread();
        bVar11 = true;
        if ((pEVar8 != (ErrState *)0x0) && (pEVar8->code == PHYSFS_ERR_NOT_FOUND)) {
          uVar3 = 0;
        }
      }
      else {
        bVar11 = local_58.filetype != PHYSFS_FILETYPE_SYMLINK;
      }
      if (pcVar7 != (char *)0x0) {
        *pcVar7 = '/';
      }
      if (bVar11) {
        if (uVar3 == 0) {
          uVar3 = (uint)(allowMissing != 0 || pcVar7 == (char *)0x0);
          cVar2 = '\t';
        }
        else {
          if (pcVar7 != (char *)0x0) {
            pcVar9 = pcVar7 + 1;
          }
          cVar2 = (pcVar7 == (char *)0x0) * '\t';
        }
      }
      else {
        PHYSFS_setErrorCode(PHYSFS_ERR_SYMLINK_FORBIDDEN);
        cVar2 = '\x01';
      }
    } while (cVar2 == '\0');
    if (cVar2 != '\t') {
      uVar3 = 0;
    }
  }
  return uVar3;
}

Assistant:

static int verifyPath(DirHandle *h, char **_fname, int allowMissing)
{
    char *fname = *_fname;
    int retval = 1;
    char *start;
    char *end;

    if ((*fname == '\0') && (!h->root))  /* quick rejection. */
        return 1;

    /* !!! FIXME: This codeblock sucks. */
    if (h->mountPoint != NULL)  /* NULL mountpoint means "/". */
    {
        size_t mntpntlen = strlen(h->mountPoint);
        size_t len = strlen(fname);
        assert(mntpntlen > 1); /* root mount points should be NULL. */
        /* not under the mountpoint, so skip this archive. */
        BAIL_IF(len < mntpntlen-1, PHYSFS_ERR_NOT_FOUND, 0);
        /* !!! FIXME: Case insensitive? */
        retval = strncmp(h->mountPoint, fname, mntpntlen-1);
        BAIL_IF(retval != 0, PHYSFS_ERR_NOT_FOUND, 0);
        if (len > mntpntlen-1)  /* corner case... */
            BAIL_IF(fname[mntpntlen-1]!='/', PHYSFS_ERR_NOT_FOUND, 0);
        fname += mntpntlen-1;  /* move to start of actual archive path. */
        if (*fname == '/')
            fname++;
        *_fname = fname;  /* skip mountpoint for later use. */
        retval = 1;  /* may be reset, below. */
    } /* if */

    /* prepend the root directory, if any. */
    if (h->root)
    {
        const int isempty = (*fname == '\0');
        fname -= h->rootlen - 1;
        strcpy(fname, h->root);
        if (!isempty)
            fname[h->rootlen - 2] = '/';
        *_fname = fname;
    } /* if */

    start = fname;
    if (!allowSymLinks)
    {
        while (1)
        {
            PHYSFS_Stat statbuf;
            int rc = 0;
            end = strchr(start, '/');

            if (end != NULL) *end = '\0';
            rc = h->funcs->stat(h->opaque, fname, &statbuf);
            if (rc)
                rc = (statbuf.filetype == PHYSFS_FILETYPE_SYMLINK);
            else if (currentErrorCode() == PHYSFS_ERR_NOT_FOUND)
                retval = 0;

            if (end != NULL) *end = '/';

            /* insecure path (has a disallowed symlink in it)? */
            BAIL_IF(rc, PHYSFS_ERR_SYMLINK_FORBIDDEN, 0);

            /* break out early if path element is missing. */
            if (!retval)
            {
                /*
                 * We need to clear it if it's the last element of the path,
                 *  since this might be a non-existant file we're opening
                 *  for writing...
                 */
                if ((end == NULL) || (allowMissing))
                    retval = 1;
                break;
            } /* if */

            if (end == NULL)
                break;

            start = end + 1;
        } /* while */
    } /* if */

    return retval;
}